

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O3

void Set_Value_Into_String(Am_Value *value)

{
  char cVar1;
  ostream *poVar2;
  char line [100];
  ostrstream oss;
  char acStack_1e8 [112];
  ostrstream local_178 [360];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value is `",10);
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ostream::flush();
  cVar1 = Am_Value::Valid();
  if (cVar1 != '\0') {
    std::ostrstream::ostrstream(local_178,acStack_1e8,100,_S_out);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_178,"Value is `",10);
    poVar2 = (ostream *)operator<<((ostream *)local_178,value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::ostream::put((char)poVar2);
    Am_Object::Set(0x8298,(char *)0xab,(ulong)acStack_1e8);
    std::ostrstream::~ostrstream(local_178);
  }
  return;
}

Assistant:

void Set_Value_Into_String(Am_Value &value) {
  cout << "Value is `" << value << "'" << endl << flush;
  if (value.Valid()) { //otherwise, user hit Cancel
    char line[100];
    OSTRSTREAM_CONSTR (oss,line, 100, ios::out);
    oss << "Value is `" << value << "'" << ends;
    OSTRSTREAM_COPY(oss,line,100);
    pop_up_value_string.Set(Am_TEXT, line);
  }
}